

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QSocks5RevivedDatagram>::relocate
          (QArrayDataPointer<QSocks5RevivedDatagram> *this,qsizetype offset,
          QSocks5RevivedDatagram **data)

{
  bool bVar1;
  char *n;
  QSocks5RevivedDatagram *in_RDX;
  long in_RSI;
  QSocks5RevivedDatagram *in_RDI;
  QSocks5RevivedDatagram **unaff_retaddr;
  QSocks5RevivedDatagram *res;
  QSocks5RevivedDatagram *c;
  
  n = (in_RDI->data).d.ptr + in_RSI * 0x28;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QSocks5RevivedDatagram,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (QSocks5RevivedDatagram *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QSocks5RevivedDatagram>,QSocks5RevivedDatagram_const*>
                        (unaff_retaddr,(QArrayDataPointer<QSocks5RevivedDatagram> *)c), bVar1)) {
    (in_RDX->data).d.d = (Data *)(in_RSI * 0x28 + (long)(in_RDX->data).d.d);
  }
  (in_RDI->data).d.ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }